

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hpp
# Opt level: O0

void __thiscall zmq::peer_t::~peer_t(peer_t *this)

{
  void *in_RDI;
  
  ~peer_t((peer_t *)0x1f0a28);
  operator_delete(in_RDI,0x758);
  return;
}

Assistant:

class peer_t ZMQ_FINAL : public server_t
{
  public:
    peer_t (zmq::ctx_t *parent_, uint32_t tid_, int sid_);

    //  Overrides of functions from socket_base_t.
    void xattach_pipe (zmq::pipe_t *pipe_,
                       bool subscribe_to_all_,
                       bool locally_initiated_);

    uint32_t connect_peer (const char *endpoint_uri_);

  private:
    uint32_t _peer_last_routing_id;

    ZMQ_NON_COPYABLE_NOR_MOVABLE (peer_t)
}